

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.hpp
# Opt level: O3

idx_t duckdb::UncompressedStringStorage::StringAppendBase
                (BufferHandle *handle,ColumnSegment *segment,SegmentStatistics *stats,
                UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  ulong uVar1;
  atomic<unsigned_long> *paVar2;
  anon_union_16_2_67f50693_for_value *value;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  __int_type _Var6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  data_ptr_t pdVar9;
  BlockManager *pBVar10;
  optional_ptr<duckdb::FileBuffer,_true> *poVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  BlockHandle *pBVar15;
  idx_t iVar16;
  idx_t iVar17;
  block_id_t *pbVar18;
  ulong uVar19;
  char *__src;
  idx_t iVar20;
  int32_t current_offset;
  block_id_t block;
  idx_t local_a8;
  int32_t local_74;
  idx_t local_70;
  BaseStatistics *local_68;
  long local_60;
  ulong local_58;
  shared_ptr<duckdb::BlockHandle,_true> *local_50;
  data_ptr_t local_48;
  optional_ptr<duckdb::FileBuffer,_true> *local_40;
  block_id_t local_38;
  
  local_40 = &handle->node;
  local_68 = &stats->statistics;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_40);
  puVar5 = (uint *)((handle->node).ptr)->buffer;
  local_48 = data->data;
  uVar14 = RemainingSpace(segment,handle);
  _Var6 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  local_a8 = count;
  if (count != 0) {
    local_50 = &segment->block;
    iVar17 = -_Var6;
    local_60 = offset * 4;
    iVar20 = 0;
    local_70 = iVar17;
    do {
      poVar11 = local_40;
      psVar7 = data->sel->sel_vector;
      if (psVar7 == (sel_t *)0x0) {
        uVar19 = offset + iVar20;
      }
      else {
        uVar19 = (ulong)*(uint *)((long)psVar7 + iVar20 * 4 + local_60);
      }
      local_a8 = iVar20;
      if (uVar14 < 4) break;
      uVar1 = uVar14 - 4;
      puVar8 = (data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((puVar8[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) {
        local_58 = uVar14;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_40);
        uVar12 = puVar5[1];
        pdVar9 = poVar11->ptr->buffer;
        value = (anon_union_16_2_67f50693_for_value *)(local_48 + uVar19 * 0x10);
        uVar3 = *(uint *)(local_48 + uVar19 * 0x10);
        uVar19 = (ulong)uVar3;
        pBVar15 = shared_ptr<duckdb::BlockHandle,_true>::operator->(local_50);
        pBVar10 = pBVar15->block_manager;
        iVar17 = optional_idx::GetIndex(&pBVar10->block_alloc_size);
        iVar16 = optional_idx::GetIndex(&pBVar10->block_header_size);
        uVar14 = iVar17 - iVar16 >> 2 & 0xfffffffffffffff8;
        if (0xfff < uVar14) {
          uVar14 = 0x1000;
        }
        if (uVar3 < (uint)uVar14) {
          uVar14 = uVar1 - uVar19;
          if (uVar1 < uVar19) break;
          StringStats::Update(local_68,(string_t *)&value->pointer);
          uVar4 = *puVar5;
          *puVar5 = uVar4 + uVar3;
          if ((((anon_union_16_2_67f50693_for_value *)&(value->pointer).length)->pointer).length <
              0xd) {
            __src = (value->pointer).prefix;
          }
          else {
            __src = (value->pointer).ptr;
          }
          switchD_00b03519::default(pdVar9 + ((ulong)uVar12 - (ulong)(uVar4 + uVar3)),__src,uVar19);
          uVar12 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar5);
          puVar5[_Var6 + iVar20 + 2] = uVar12;
          iVar17 = local_70;
        }
        else {
          if (uVar1 < 0xc) break;
          StringStats::Update(local_68,(string_t *)&value->pointer);
          WriteString(segment,(string_t)value->pointer,&local_38,&local_74);
          uVar3 = *puVar5;
          *puVar5 = uVar3 + 0xc;
          uVar14 = local_58 - 0x10;
          pbVar18 = (block_id_t *)(pdVar9 + ((ulong)uVar12 - (ulong)(uVar3 + 0xc)));
          *pbVar18 = local_38;
          *(int32_t *)(pbVar18 + 1) = local_74;
          iVar13 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar5);
          puVar5[_Var6 + iVar20 + 2] = -iVar13;
          iVar17 = local_70;
        }
      }
      else {
        uVar14 = uVar1;
        if (iVar17 == iVar20) {
          puVar5[2] = 0;
        }
        else {
          puVar5[_Var6 + iVar20 + 2] = puVar5[_Var6 + iVar20 + 1];
        }
      }
      iVar20 = iVar20 + 1;
      local_a8 = count;
    } while (count != iVar20);
  }
  LOCK();
  paVar2 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + local_a8;
  UNLOCK();
  return local_a8;
}

Assistant:

static idx_t StringAppendBase(BufferHandle &handle, ColumnSegment &segment, SegmentStatistics &stats,
	                              UnifiedVectorFormat &data, idx_t offset, idx_t count) {
		D_ASSERT(segment.GetBlockOffset() == 0);
		auto handle_ptr = handle.Ptr();
		auto source_data = UnifiedVectorFormat::GetData<string_t>(data);
		auto result_data = reinterpret_cast<int32_t *>(handle_ptr + DICTIONARY_HEADER_SIZE);
		auto dictionary_size = reinterpret_cast<uint32_t *>(handle_ptr);
		auto dictionary_end = reinterpret_cast<uint32_t *>(handle_ptr + sizeof(uint32_t));

		idx_t remaining_space = RemainingSpace(segment, handle);
		auto base_count = segment.count.load();
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = data.sel->get_index(offset + i);
			auto target_idx = base_count + i;
			if (remaining_space < sizeof(int32_t)) {
				// string index does not fit in the block at all
				segment.count += i;
				return i;
			}
			remaining_space -= sizeof(int32_t);
			if (!data.validity.RowIsValid(source_idx)) {
				// null value is stored as a copy of the last value, this is done to be able to efficiently do the
				// string_length calculation
				if (target_idx > 0) {
					result_data[target_idx] = result_data[target_idx - 1];
				} else {
					result_data[target_idx] = 0;
				}
				continue;
			}
			auto end = handle.Ptr() + *dictionary_end;

#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
			// Unknown string, continue
			// non-null value, check if we can fit it within the block
			idx_t string_length = source_data[source_idx].GetSize();

			// determine whether or not we have space in the block for this string
			bool use_overflow_block = false;
			idx_t required_space = string_length;
			if (DUCKDB_UNLIKELY(required_space >=
			                    StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize()))) {
				// string exceeds block limit, store in overflow block and only write a marker here
				required_space = BIG_STRING_MARKER_SIZE;
				use_overflow_block = true;
			}
			if (DUCKDB_UNLIKELY(required_space > remaining_space)) {
				// no space remaining: return how many tuples we ended up writing
				segment.count += i;
				return i;
			}

			// we have space: write the string
			UpdateStringStats(stats, source_data[source_idx]);

			if (DUCKDB_UNLIKELY(use_overflow_block)) {
				// write to overflow blocks
				block_id_t block;
				int32_t current_offset;
				// write the string into the current string block
				WriteString(segment, source_data[source_idx], block, current_offset);
				*dictionary_size += BIG_STRING_MARKER_SIZE;
				remaining_space -= BIG_STRING_MARKER_SIZE;
				auto dict_pos = end - *dictionary_size;

				// write a big string marker into the dictionary
				WriteStringMarker(dict_pos, block, current_offset);

				// place the dictionary offset into the set of vectors
				// note: for overflow strings we write negative value

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				result_data[target_idx] = -NumericCast<int32_t>((*dictionary_size));
			} else {
				// string fits in block, append to dictionary and increment dictionary position
				D_ASSERT(string_length < NumericLimits<uint16_t>::Maximum());
				*dictionary_size += required_space;
				remaining_space -= required_space;
				auto dict_pos = end - *dictionary_size;
				// now write the actual string data into the dictionary
				memcpy(dict_pos, source_data[source_idx].GetData(), string_length);

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				// Place the dictionary offset into the set of vectors.
				result_data[target_idx] = NumericCast<int32_t>(*dictionary_size);
			}
			D_ASSERT(RemainingSpace(segment, handle) <= segment.GetBlockManager().GetBlockSize());
#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
		}
		segment.count += count;
		return count;
	}